

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O3

void __thiscall
duckdb::WindowExecutorLocalState::Finalize
          (WindowExecutorLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection
          )

{
  column_t col_idx;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> __ptr;
  optional_ptr<duckdb::WindowCollection,_true> paged;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> this_00;
  optional_ptr<duckdb::WindowCollection,_true> local_28;
  
  col_idx = gstate->executor->range_idx;
  if (col_idx != 0xffffffffffffffff) {
    local_28.ptr = collection.ptr;
    optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_28);
    paged.ptr = local_28.ptr;
    this_00._M_head_impl = (WindowCursor *)operator_new(200);
    WindowCursor::WindowCursor(this_00._M_head_impl,paged.ptr,col_idx);
    __ptr._M_head_impl =
         (this->range_cursor).
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    (this->range_cursor).
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = this_00._M_head_impl;
    if (__ptr._M_head_impl != (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&this->range_cursor,__ptr._M_head_impl);
    }
  }
  return;
}

Assistant:

void WindowExecutorLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	const auto range_idx = gstate.executor.range_idx;
	if (range_idx != DConstants::INVALID_INDEX) {
		range_cursor = make_uniq<WindowCursor>(*collection, range_idx);
	}
}